

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O2

Type * __thiscall
slang::ast::builtins::ArraySortMethod::checkArguments
          (ArraySortMethod *this,ASTContext *context,Args *args,SourceRange range,
          Expression *iterExpr)

{
  Compilation *pCVar1;
  bool bVar2;
  Type *type;
  Diagnostic *this_00;
  long lVar3;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar2 = SystemSubroutine::checkArgCount(&this->super_SystemSubroutine,context,true,args,range,0,0)
  ;
  lVar3 = 400;
  if ((bVar2) && (bVar2 = SystemSubroutine::registerLValue(*args->_M_ptr,context), bVar2)) {
    if (iterExpr == (Expression *)0x0) {
      type = Type::getArrayElementType(((*args->_M_ptr)->type).ptr);
      bVar2 = isComparable(type);
      lVar3 = 0x188;
      if (bVar2) goto LAB_00381d52;
      iterExpr = *args->_M_ptr;
    }
    else {
      bVar2 = isComparable((iterExpr->type).ptr);
      lVar3 = 0x188;
      if (bVar2) goto LAB_00381d52;
    }
    this_00 = ASTContext::addDiag(context,(DiagCode)0x1000b,iterExpr->sourceRange);
    Diagnostic::operator<<(this_00,&(this->super_SystemSubroutine).name);
    lVar3 = 400;
  }
LAB_00381d52:
  return *(Type **)((long)&(pCVar1->super_BumpAllocator).head + lVar3);
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression* iterExpr) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, true, args, range, 0, 0))
            return comp.getErrorType();

        if (!registerLValue(*args[0], context))
            return comp.getErrorType();

        if (iterExpr) {
            if (!isComparable(*iterExpr->type)) {
                context.addDiag(diag::ArrayMethodComparable, iterExpr->sourceRange) << name;
                return comp.getErrorType();
            }
        }
        else {
            auto elemType = args[0]->type->getArrayElementType();
            SLANG_ASSERT(elemType);

            if (!isComparable(*elemType)) {
                context.addDiag(diag::ArrayMethodComparable, args[0]->sourceRange) << name;
                return comp.getErrorType();
            }
        }

        return comp.getVoidType();
    }